

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<PairedReadsMapper&,std::__cxx11::string>::
load_impl_sequence<0ul,1ul>
          (argument_loader<PairedReadsMapper&,std::__cxx11::string> *this,long call)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x20),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  bVar2 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  *)this,*(PyObject **)(*(long *)(call + 8) + 8),
                 SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  return bVar2 && bVar1;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }